

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_map * mg_map_copy_ca(mg_map *map,mg_allocator *allocator)

{
  mg_string *pmVar1;
  mg_value *pmVar2;
  undefined8 in_RSI;
  uint *in_RDI;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t values_copied;
  uint32_t keys_copied;
  mg_map *nmap;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  mg_allocator *in_stack_ffffffffffffffe0;
  mg_map *local_8;
  
  if (in_RDI == (uint *)0x0) {
    local_8 = (mg_map *)0x0;
  }
  else {
    local_8 = mg_map_alloc((uint32_t)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe0);
    if (local_8 == (mg_map *)0x0) {
      local_8 = (mg_map *)0x0;
    }
    else {
      local_8->capacity = *in_RDI;
      local_8->size = *in_RDI;
      uVar6 = 0;
      uVar5 = 0;
      for (uVar4 = 0; uVar4 < *in_RDI; uVar4 = uVar4 + 1) {
        pmVar1 = mg_string_copy_ca((mg_string *)CONCAT44(uVar6,uVar5),
                                   (mg_allocator *)CONCAT44(uVar4,in_stack_ffffffffffffffd0));
        local_8->keys[uVar4] = pmVar1;
        if (local_8->keys[uVar4] == (mg_string *)0x0) {
LAB_0010ea25:
          for (uVar3 = 0; uVar3 < uVar6; uVar3 = uVar3 + 1) {
            mg_string_destroy((mg_string *)0x10ea4d);
          }
          for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
            mg_value_destroy((mg_value *)0x10ea82);
          }
          mg_allocator_free((mg_allocator *)CONCAT44(uVar4,uVar3),
                            (void *)CONCAT44(uVar6,in_stack_ffffffffffffffc8));
          return (mg_map *)0x0;
        }
        uVar6 = uVar6 + 1;
        pmVar2 = mg_value_copy_ca((mg_value *)CONCAT44(uVar6,uVar5),
                                  (mg_allocator *)CONCAT44(uVar4,in_stack_ffffffffffffffd0));
        local_8->values[uVar4] = pmVar2;
        if (local_8->values[uVar4] == (mg_value *)0x0) goto LAB_0010ea25;
        uVar5 = uVar5 + 1;
      }
    }
  }
  return local_8;
}

Assistant:

mg_map *mg_map_copy_ca(const mg_map *map, mg_allocator *allocator) {
  if (!map) {
    return NULL;
  }
  mg_map *nmap = mg_map_alloc(map->size, allocator);
  if (!nmap) {
    return NULL;
  }
  nmap->capacity = map->size;
  nmap->size = map->size;
  uint32_t keys_copied = 0;
  uint32_t values_copied = 0;
  for (uint32_t i = 0; i < map->size; ++i) {
    nmap->keys[i] = mg_string_copy_ca(map->keys[i], allocator);
    if (!nmap->keys[i]) {
      goto cleanup;
    }
    keys_copied++;
    nmap->values[i] = mg_value_copy_ca(map->values[i], allocator);
    if (!nmap->values[i]) {
      goto cleanup;
    }
    values_copied++;
  }
  return nmap;

cleanup:
  for (uint32_t i = 0; i < keys_copied; ++i) {
    mg_string_destroy(map->keys[i]);
  }
  for (uint32_t i = 0; i < values_copied; ++i) {
    mg_value_destroy(map->values[i]);
  }
  mg_allocator_free(&mg_system_allocator, nmap);
  return NULL;
}